

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O2

token_t __thiscall grammar::get_nonterminal(grammar *this,symbol_t *symbol)

{
  bool bVar1;
  token_t tVar2;
  undefined8 in_RAX;
  _Base_ptr p_Var3;
  string *psVar4;
  _Rb_tree_node_base *__k;
  undefined8 uStack_28;
  
  p_Var3 = (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  uStack_28 = in_RAX;
  do {
    if ((_Rb_tree_header *)p_Var3 == &(this->symbols)._M_t._M_impl.super__Rb_tree_header) {
      tVar2 = next_nonterminal(this);
      __k = (_Rb_tree_node_base *)((long)&uStack_28 + 4);
      uStack_28 = CONCAT44(tVar2.internal_rep,(undefined4)uStack_28);
      psVar4 = (string *)
               std::
               map<strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>_>_>
               ::operator[](&this->symbols,(key_type *)__k);
      std::__cxx11::string::_M_assign(psVar4);
LAB_0010441a:
      return (token_t)__k->_M_color;
    }
    bVar1 = operator==((this_t *)&p_Var3[1]._M_parent,symbol);
    if (bVar1) {
      __k = p_Var3 + 1;
      goto LAB_0010441a;
    }
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

token_t grammar::get_nonterminal(const symbol_t & symbol) {
    const auto iter = std::find_if(
        symbols.begin(), symbols.end(),
        [&symbol](const auto & item) { return item.second == symbol; });
    if (iter != symbols.end()) {
        return iter->first;
    } else {
        const auto to_ret = next_nonterminal();
        symbols[to_ret]   = symbol;
        // Rules are added in the parser / manually
        return to_ret;
    }
}